

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void anon_unknown.dwarf_113fb::_scale
               (uint32_t *Target,int TgtWidth,int TgtHeight,uint32_t *Source,int SrcWidth,
               int SrcHeight)

{
  int iVar1;
  uint32_t *local_40;
  uint32_t *PrevSource;
  int E;
  int FractPart;
  int IntPart;
  int NumPixels;
  int SrcHeight_local;
  int SrcWidth_local;
  uint32_t *Source_local;
  int TgtHeight_local;
  int TgtWidth_local;
  uint32_t *Target_local;
  
  PrevSource._0_4_ = 0;
  local_40 = (uint32_t *)0x0;
  FractPart = TgtHeight;
  _SrcHeight_local = Source;
  _TgtHeight_local = Target;
  while (iVar1 = FractPart + -1, 0 < FractPart) {
    if (_SrcHeight_local == local_40) {
      memcpy(_TgtHeight_local,_TgtHeight_local + -(long)TgtWidth,(long)TgtWidth << 2);
    }
    else {
      _scale_line(_TgtHeight_local,_SrcHeight_local,SrcWidth,TgtWidth);
      local_40 = _SrcHeight_local;
    }
    _TgtHeight_local = _TgtHeight_local + TgtWidth;
    _SrcHeight_local = _SrcHeight_local + (SrcHeight / TgtHeight) * SrcWidth;
    PrevSource._0_4_ = SrcHeight % TgtHeight + (int)PrevSource;
    FractPart = iVar1;
    if (TgtHeight <= (int)PrevSource) {
      PrevSource._0_4_ = (int)PrevSource - TgtHeight;
      _SrcHeight_local = _SrcHeight_local + SrcWidth;
    }
  }
  return;
}

Assistant:

void _scale(uint32_t* Target, int TgtWidth, int TgtHeight, const uint32_t* Source, int SrcWidth, int SrcHeight)
    {    
    // image scaling with Bresenham, Thiadmer Riemersma, Dr.Dobb's.    
    int NumPixels = TgtHeight;
    int IntPart = (SrcHeight / TgtHeight) * SrcWidth;
    int FractPart = SrcHeight % TgtHeight;
    int E = 0;
    const uint32_t* PrevSource = nullptr;
    while (NumPixels-- > 0)
      {
      
      if (Source == PrevSource)
        {
        memcpy(Target, Target-TgtWidth, TgtWidth*sizeof(uint32_t));
        }
      else
        {
        _scale_line(Target, Source, SrcWidth, TgtWidth);
        PrevSource = Source;
        }
      
      Target += TgtWidth;
      Source += IntPart;
      E += FractPart;
      if (E >= TgtHeight)
        {
        E -= TgtHeight;
        Source += SrcWidth;
        }        
      }
    }